

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O3

bool __thiscall hwtest::pgraph::BetaRegister::scan_test(BetaRegister *this,int cnum,mt19937 *rnd)

{
  uint uVar1;
  uint uVar2;
  result_type rVar3;
  uint uVar4;
  bool bVar5;
  
  bVar5 = true;
  uVar4 = 0;
  while( true ) {
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    (*(this->super_SimpleMmioRegister).super_MmioRegister.super_Register._vptr_Register[7])
              (this,cnum,rVar3 & 0xffffffff);
    uVar1 = (uint)rVar3 & 0x7f800000;
    if ((int)(uint)rVar3 < 0) {
      uVar1 = 0;
    }
    uVar2 = (*(this->super_SimpleMmioRegister).super_MmioRegister.super_Register._vptr_Register[6])
                      (this,cnum);
    if (uVar2 != uVar1) break;
    bVar5 = uVar4 < 999;
    uVar4 = uVar4 + 1;
    if (uVar4 == 1000) {
      return false;
    }
  }
  printf("BETA scan mismatch: orig %08x expected %08x real %08x\n",rVar3 & 0xffffffff,(ulong)uVar1,
         (ulong)uVar2);
  return bVar5;
}

Assistant:

bool scan_test(int cnum, std::mt19937 &rnd) override {
		for (int i = 0; i < 1000; i++) {
			uint32_t orig = rnd();
			write(cnum, orig);
			uint32_t exp = orig & 0x7f800000;
			if (orig & 0x80000000)
				exp = 0;
			uint32_t real = read(cnum);
			if (real != exp) {
				printf("BETA scan mismatch: orig %08x expected %08x real %08x\n", orig, exp, real);
				return true;
			}
		}
		return false;
	}